

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall MinVR::element::set_name(element *this,char *the_name)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  
  if (the_name != (char *)0x0) {
    sVar2 = strlen(the_name);
    bVar1 = (sVar2 & 0xffffffff) != 0;
    if (bVar1) {
      if (this->name_is_allocated == true) {
        free(this->m_name);
      }
      sVar2 = (long)(int)sVar2 + 1;
      __dest = (char *)malloc(sVar2);
      this->m_name = __dest;
      memset(__dest,0,sVar2);
      strcpy(__dest,the_name);
      this->name_is_allocated = true;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool element::set_name(const char* the_name)
{
    if(the_name != NULL)
    {
        int l;
        l=(int)strlen(the_name)*sizeof(char);
        if(l == 0)
            return false;
        if(name_is_allocated)
            free(m_name);
        m_name = (char*)malloc(l+sizeof(char));
        memset(m_name,'\0',l+sizeof(char));
        strcpy(m_name,the_name);
        name_is_allocated = true;
        return true;
    }
    return false;
}